

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * u8tou8_path(char *source,char *dest)

{
  size_t sVar1;
  char *pcVar2;
  
  if (source != (char *)0x0 && dest != (char *)0x0) {
    sVar1 = strlen(source);
    if ((int)sVar1 < 0x104) {
      pcVar2 = strcpy(dest,source);
      return pcVar2;
    }
  }
  g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
  return (char *)0x0;
}

Assistant:

char *u8tou8_path(const char *source, char *dest)
{
	if (dest == NULL || source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	int size = strlen(source);
	if (size >= MAX_PATH)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	return strcpy(dest, source);
}